

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

void __thiscall Js::WebAssemblyModule::SwapWasmFunctionInfo(WebAssemblyModule *this,uint i1,uint i2)

{
  List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  WasmFunctionInfo *local_28;
  WasmFunctionInfo *f2;
  WasmFunctionInfo *f1;
  uint i2_local;
  uint i1_local;
  WebAssemblyModule *this_local;
  
  f1._0_4_ = i2;
  f1._4_4_ = i1;
  _i2_local = this;
  f2 = GetWasmFunctionInfo(this,i1);
  local_28 = GetWasmFunctionInfo(this,(uint)f1);
  pLVar1 = Memory::
           WriteBarrierPtr<JsUtil::List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->m_functionsInfo);
  JsUtil::
  List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  SetItem(pLVar1,f1._4_4_,&local_28);
  pLVar1 = Memory::
           WriteBarrierPtr<JsUtil::List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->m_functionsInfo);
  JsUtil::
  List<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  SetItem(pLVar1,(uint)f1,&f2);
  return;
}

Assistant:

void
WebAssemblyModule::SwapWasmFunctionInfo(uint i1, uint i2)
{
    Wasm::WasmFunctionInfo* f1 = GetWasmFunctionInfo(i1);
    Wasm::WasmFunctionInfo* f2 = GetWasmFunctionInfo(i2);
    m_functionsInfo->SetItem(i1, f2);
    m_functionsInfo->SetItem(i2, f1);
}